

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::FieldDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  _func_int **pp_Var2;
  Arena *pAVar3;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *value;
  MessageLite *pMVar4;
  Arena *arena;
  
  pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  arena = pAVar3;
  if (((ulong)pAVar3 & 1) != 0) {
    arena = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar4 = from_msg;
    MergeImpl();
    pAVar3 = extraout_RDX;
LAB_00f1dd66:
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
LAB_00f1dbf5:
    protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar4,value,pAVar3);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((char)unaff_EBP == '\0') goto LAB_00f1dce2;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[1]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      pMVar4 = (MessageLite *)&to_msg[1]._internal_metadata_;
      if (((ulong)pAVar3 & 1) != 0) goto LAB_00f1dd66;
      goto LAB_00f1dbf5;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    pp_Var2 = from_msg[2]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 2),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar3
              );
  }
  if ((unaff_EBP & 4) != 0) {
    uVar1 = from_msg[2]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[2]._internal_metadata_,
               (string *)(uVar1 & 0xfffffffffffffffc),pAVar3);
  }
  if ((unaff_EBP & 8) != 0) {
    pp_Var2 = from_msg[3]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 8;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 3),(string *)((ulong)pp_Var2 & 0xfffffffffffffffc),pAVar3
              );
  }
  if ((unaff_EBP & 0x10) != 0) {
    uVar1 = from_msg[3]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x10;
    pAVar3 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[3]._internal_metadata_,
               (string *)(uVar1 & 0xfffffffffffffffc),pAVar3);
  }
  if ((unaff_EBP & 0x20) != 0) {
    pMVar4 = (MessageLite *)from_msg[4]._vptr_MessageLite;
    if (pMVar4 == (MessageLite *)0x0) {
      MergeImpl((FieldDescriptorProto *)&stack0xffffffffffffffd0);
    }
    if ((MessageLite *)to_msg[4]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var2 = (_func_int **)Arena::CopyConstruct<google::protobuf::FieldOptions>(arena,pMVar4);
      to_msg[4]._vptr_MessageLite = pp_Var2;
    }
    else {
      FieldOptions::MergeImpl((MessageLite *)to_msg[4]._vptr_MessageLite,pMVar4);
    }
  }
  if ((unaff_EBP & 0x40) != 0) {
    *(int *)&to_msg[4]._internal_metadata_.ptr_ = (int)from_msg[4]._internal_metadata_.ptr_;
  }
  if ((char)unaff_EBP < '\0') {
    *(undefined4 *)((long)&to_msg[4]._internal_metadata_.ptr_ + 4) =
         *(undefined4 *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4);
  }
LAB_00f1dce2:
  if ((unaff_EBP & 0x700) != 0) {
    if ((unaff_EBP >> 8 & 1) != 0) {
      *(undefined1 *)&to_msg[5]._vptr_MessageLite = *(undefined1 *)&from_msg[5]._vptr_MessageLite;
    }
    if ((unaff_EBP >> 9 & 1) != 0) {
      *(undefined4 *)((long)&to_msg[5]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[5]._vptr_MessageLite + 4);
    }
    if ((unaff_EBP >> 10 & 1) != 0) {
      *(int *)&to_msg[5]._internal_metadata_.ptr_ = (int)from_msg[5]._internal_metadata_.ptr_;
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
    return;
  }
  return;
}

Assistant:

void FieldDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FieldDescriptorProto*>(&to_msg);
  auto& from = static_cast<const FieldDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_extendee(from._internal_extendee());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_type_name(from._internal_type_name());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_default_value(from._internal_default_value());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_internal_set_json_name(from._internal_json_name());
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.number_ = from._impl_.number_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.oneof_index_ = from._impl_.oneof_index_;
    }
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.proto3_optional_ = from._impl_.proto3_optional_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.label_ = from._impl_.label_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.type_ = from._impl_.type_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}